

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void Wavegeneral_v(Mat *a,int JJ,int n,int isign,double *P,double *Q,int fsize)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  int k;
  int iVar5;
  ulong uVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  undefined8 uVar14;
  double dVar15;
  long local_50;
  long local_48;
  
  if (fsize <= n) {
    iVar12 = n >> 1;
    if (isign < 0) {
      iVar5 = iVar12 + fsize / -2;
      iVar1 = *(int *)(a + 8);
      local_48 = *(long *)(a + 0x10);
      plVar2 = *(long **)(a + 0x48);
      lVar11 = local_48 + (long)JJ * 4;
      for (lVar4 = 0; iVar5 = iVar5 + 1, lVar4 < n; lVar4 = lVar4 + 2) {
        (Wavegeneral_v::b + lVar4)[0] = 0.0;
        (Wavegeneral_v::b + lVar4)[1] = 0.0;
        uVar14 = 0;
        iVar7 = iVar5;
        for (uVar10 = (ulong)(uint)fsize; 1 < (int)uVar10; uVar10 = uVar10 - 2) {
          iVar3 = (int)((long)((ulong)(uint)((int)((long)iVar7 % (long)iVar1) >> 0x1f) << 0x20 |
                              (long)iVar7 % (long)iVar1 & 0xffffffffU) % (long)iVar12);
          dVar13 = (double)*(float *)(lVar11 + *plVar2 * (long)iVar3);
          dVar15 = (double)*(float *)(lVar11 + (long)(iVar3 + iVar12) * *plVar2);
          uVar14 = CONCAT44((float)(dVar13 * (P + (uVar10 - 2))[1] + dVar15 * (Q + (uVar10 - 2))[1]
                                   + (double)(float)((ulong)uVar14 >> 0x20)),
                            (float)(dVar13 * P[uVar10 - 2] + dVar15 * Q[uVar10 - 2] +
                                   (double)(float)uVar14));
          *(undefined8 *)(Wavegeneral_v::b + lVar4) = uVar14;
          iVar7 = iVar7 + 1;
        }
      }
    }
    else {
      local_48 = *(long *)(a + 0x10);
      plVar2 = *(long **)(a + 0x48);
      uVar9 = 0;
      uVar10 = (ulong)(uint)fsize;
      if (fsize < 1) {
        uVar10 = uVar9;
      }
      lVar11 = 0;
      for (; (long)uVar9 < (long)n; uVar9 = uVar9 + 2) {
        Wavegeneral_v::b[lVar11] = 0.0;
        lVar4 = lVar11 + iVar12;
        Wavegeneral_v::b[lVar4] = 0.0;
        for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
          dVar13 = (double)*(float *)(local_48 + (long)JJ * 4 +
                                     ((long)((int)uVar9 + (int)uVar6) % (long)n & 0xffffffffU) *
                                     *plVar2);
          Wavegeneral_v::b[lVar11] = (float)(P[uVar6] * dVar13 + (double)Wavegeneral_v::b[lVar11]);
          Wavegeneral_v::b[lVar4] = (float)(dVar13 * Q[uVar6] + (double)Wavegeneral_v::b[lVar4]);
        }
        lVar11 = lVar11 + 1;
      }
    }
    local_50 = (long)JJ;
    uVar9 = 0;
    uVar10 = (ulong)(uint)n;
    if (n < 1) {
      uVar10 = uVar9;
    }
    pfVar8 = Wavegeneral_v::b;
    for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      *(float *)(local_48 + local_50 * 4 + *plVar2 * uVar9) = *pfVar8;
      pfVar8 = pfVar8 + 1;
    }
  }
  return;
}

Assistant:

static void 
Wavegeneral_v(cv::Mat& a, int JJ, int n, int isign, double *P, double *Q, int fsize)
{
  static float b[1024];
	
  if (n < fsize) return;
  int nh = n >> 1;
	
  if (isign >= 0) 
  {
    for (int i = 0, j = 0; j < n; j+=2, ++i) 
    {
      b[i]=0.0f;
      b[i+nh]=0.0f;
			
      for(int k = 0; k < fsize; ++k) 
      {
        b[i] += P[k] * a.at<float>( (j+k)%n, JJ);
        b[i+nh] += Q[k] * a.at<float>( (j+k)%n, JJ);
      }
    }
  } 
  else 
  {
    for (int i = 0,r = nh-(fsize/2-1); i < n; r+=1, i+=2) 
    {
      b[i]=0.0f;
      b[i+1]=0.0f;
			
      for(int k = fsize-2, j = 0; k >= 0; k-=2, j+=1) 
      {
        b[i] += P[k] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
        b[i+1] += P[k+1] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k+1] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
      }
    }
  }
  for(int i = 0; i < n; ++i)
    a.at<float>(i, JJ) = b[i];
}